

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<TypePair,_TypePairHasher,_4U>::rehash
          (SmallDenseSet<TypePair,_TypePairHasher,_4U> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TypePair *pTVar3;
  TypePair local_40;
  TypePair *local_30;
  TypePair *item;
  TypePair *pTStack_20;
  uint i;
  TypePair *oldData;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSStack_10;
  uint oldBucketCount;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *this_local;
  
  oldData._4_4_ = this->bucketCount;
  pTStack_20 = this->data;
  this->bucketCount = this->bucketCount << 1;
  pSStack_10 = this;
  if (this->allocator == (Allocator *)0x0) {
    pTVar3 = (TypePair *)(*(code *)NULLC::alloc)(((ulong)this->bucketCount & 0xfffffff) << 4);
    this->data = pTVar3;
  }
  else {
    iVar2 = (*this->allocator->_vptr_Allocator[2])();
    this->data = (TypePair *)CONCAT44(extraout_var,iVar2);
  }
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 4);
  this->count = 0;
  for (item._4_4_ = 0; item._4_4_ < oldData._4_4_; item._4_4_ = item._4_4_ + 1) {
    pTVar3 = pTStack_20 + item._4_4_;
    local_30 = pTVar3;
    TypePair::TypePair(&local_40);
    bVar1 = TypePair::operator==(pTVar3,&local_40);
    if (!bVar1) {
      insert(this,local_30);
    }
  }
  if (pTStack_20 != this->storage) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pTStack_20);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,pTStack_20);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}